

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_info.c
# Opt level: O1

MPP_RET hal_info_init(HalInfo *ctx,MppCtxType type,MppCodingType coding)

{
  MppCtxType *pMVar1;
  MPP_RET MVar2;
  MppCtxType MVar3;
  
  if (ctx == (HalInfo *)0x0) {
    _mpp_log_l(2,(char *)0x0,"found NULL input ctx\n","hal_info_init");
    MVar2 = MPP_ERR_NULL_PTR;
  }
  else {
    MVar3 = 0x16;
    if (type == MPP_CTX_DEC) {
      MVar3 = 0xb;
    }
    pMVar1 = (MppCtxType *)mpp_osal_calloc("hal_info_init",(ulong)(MVar3 * 0x10 + 0x18));
    if (pMVar1 == (MppCtxType *)0x0) {
      MVar2 = MPP_NOK;
    }
    else {
      *pMVar1 = type;
      pMVar1[1] = coding;
      pMVar1[3] = MVar3;
      *(MppCtxType **)(pMVar1 + 4) = pMVar1 + 6;
      MVar2 = MPP_OK;
    }
    *ctx = pMVar1;
  }
  return MVar2;
}

Assistant:

MPP_RET hal_info_init(HalInfo *ctx, MppCtxType type, MppCodingType coding)
{
    if (NULL == ctx) {
        mpp_err_f("found NULL input ctx\n");
        return MPP_ERR_NULL_PTR;
    }

    MPP_RET ret = MPP_NOK;
    RK_U32 elem_nb = (type == MPP_CTX_DEC) ? (ENC_INFO_BUTT) : (DEC_INFO_BUTT);
    HalInfoImpl *impl = mpp_calloc_size(HalInfoImpl, sizeof(HalInfoImpl) +
                                        sizeof(MppDevInfoCfg) * elem_nb);
    if (impl) {
        impl->type = type;
        impl->coding = coding;
        impl->elem_nb = elem_nb;
        impl->elems = (MppDevInfoCfg *)(impl + 1);
        ret = MPP_OK;
    }

    *ctx = impl;

    return ret;
}